

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

void __thiscall QString::QString(QString *this,QLatin1StringView latin1)

{
  QString *this_00;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView *this_01;
  char *in_stack_ffffffffffffffd0;
  QLatin1StringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &local_18;
  this_00 = (QString *)QLatin1StringView::data(this_01);
  QLatin1StringView::size(this_01);
  fromLatin1(in_stack_ffffffffffffffd0,in_RDI);
  QString(this_00,(QString *)this_01);
  ~QString((QString *)0x105f0b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QString::QString(QLatin1StringView latin1)
    : QString{QString::fromLatin1(latin1.data(), latin1.size())} {}